

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select.hpp
# Opt level: O0

Gen<int> * __thiscall
rc::gen::oneOf<int,int>(Gen<int> *__return_storage_ptr__,gen *this,Gen<int> *gen,Gen<int> *gens)

{
  Gen<int> local_88;
  Gen<int> local_60;
  OneOfGen<int> local_38;
  Gen<int> *local_20;
  Gen<int> *gens_local;
  Gen<int> *gen_local;
  
  local_20 = gen;
  gens_local = (Gen<int> *)this;
  gen_local = __return_storage_ptr__;
  Gen<int>::Gen(&local_60,(Gen<int> *)this);
  Gen<int>::Gen(&local_88,gen);
  detail::OneOfGen<int>::OneOfGen<int,int>(&local_38,&local_60,&local_88);
  Gen<int>::Gen<rc::gen::detail::OneOfGen<int>,void>(__return_storage_ptr__,&local_38);
  detail::OneOfGen<int>::~OneOfGen(&local_38);
  Gen<int>::~Gen(&local_88);
  Gen<int>::~Gen(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Gen<T> oneOf(Gen<T> gen, Gen<Ts>... gens) {
  return detail::OneOfGen<T>(std::move(gen), std::move(gens)...);
}